

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

token_base ** __thiscall cs::tree_type<cs::token_base_*>::iterator::data(iterator *this)

{
  bool bVar1;
  string *str;
  iterator *in_RDI;
  error *this_00;
  undefined1 local_29 [41];
  
  bVar1 = usable(in_RDI);
  if (!bVar1) {
    str = (string *)__cxa_allocate_exception(0x28);
    this_00 = (error *)local_29;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_29 + 1),"E000E",(allocator *)this_00);
    cov::error::error(this_00,str);
    __cxa_throw(str,&cov::error::typeinfo,cov::error::~error);
  }
  return &in_RDI->mData->data;
}

Assistant:

const T &data() const
			{
				if (!this->usable())
					throw cov::error("E000E");
				return this->mData->data;
			}